

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

Fl_Type * sort(Fl_Type *parent)

{
  int iVar1;
  Fl_Type *parent_00;
  int iVar2;
  Fl_Type **ppFVar3;
  Fl_Type *pFVar4;
  Fl_Type *g;
  
  if (parent == (Fl_Type *)0x0) {
    ppFVar3 = &Fl_Type::first;
  }
  else {
    ppFVar3 = &parent->next;
  }
  pFVar4 = *ppFVar3;
  do {
    do {
      parent_00 = pFVar4;
      if ((parent_00 == (Fl_Type *)0x0) ||
         ((parent != (Fl_Type *)0x0 && (parent_00->level <= parent->level)))) {
        return parent_00;
      }
      pFVar4 = sort(parent_00);
    } while ((((parent_00->selected == '\0') ||
              (iVar2 = (*parent_00->_vptr_Fl_Type[0x17])(parent_00), iVar2 == 0)) ||
             (iVar2 = (*parent_00->_vptr_Fl_Type[0x1e])(parent_00), iVar2 != 0)) ||
            (g = parent->next, g == parent_00));
    do {
      if ((g->selected != '\0') && (g->level <= parent_00->level)) {
        iVar2 = *(int *)((long)&(parent_00[1].prev)->user_data_ + 4);
        iVar1 = *(int *)((long)&(g[1].prev)->user_data_ + 4);
        if ((iVar2 < iVar1) ||
           ((iVar1 == iVar2 &&
            (*(int *)&(parent_00[1].prev)->user_data_ < *(int *)&(g[1].prev)->user_data_)))) {
          Fl_Type::move_before(parent_00,g);
          break;
        }
      }
      g = g->next;
    } while (g != parent_00);
  } while( true );
}

Assistant:

Fl_Type *sort(Fl_Type *parent) {
  Fl_Type *f,*n=0;
  for (f = parent ? parent->next : Fl_Type::first; ; f = n) {
    if (!f || (parent && f->level <= parent->level)) return f;
    n = sort(f);
    if (!f->selected || (!f->is_widget() || f->is_menu_item())) continue;
    Fl_Widget* fw = ((Fl_Widget_Type*)f)->o;
    Fl_Type *g; // we will insert before this
    for (g = parent->next; g != f; g = g->next) {
      if (!g->selected || g->level > f->level) continue;
      Fl_Widget* gw = ((Fl_Widget_Type*)g)->o;
      if (gw->y() > fw->y()) break;
      if (gw->y() == fw->y() && gw->x() > fw->x()) break;
    }
    if (g != f) f->move_before(g);
  }
}